

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovPlatform.cpp
# Opt level: O2

cl_int cov::getPlatformInfo
                 (cl_platform_id platform,cl_platform_info paramName,size_t paramValueSize,
                 void *paramValue,size_t *paramValueSizeRet)

{
  cl_int cVar1;
  Platform *p;
  
  if (paramName - 0x900 < 5) {
    cVar1 = utils::getStringParam
                      ((string *)(platform + (ulong)((paramName - 0x900) * 0x20) + 0x10),
                       paramValueSize,paramValue,paramValueSizeRet);
    return cVar1;
  }
  return -0x1e;
}

Assistant:

cl_int getPlatformInfo(cl_platform_id platform,
                       cl_platform_info paramName,
                       size_t paramValueSize,
                       void* paramValue,
                       size_t* paramValueSizeRet)
{
    auto p = reinterpret_cast<Platform*>(platform);
    switch (paramName) {
        case CL_PLATFORM_PROFILE:
            return utils::getStringParam(p->m_profile, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_VERSION:
            return utils::getStringParam(p->m_version, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_NAME:
            return utils::getStringParam(p->m_name, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_VENDOR:
            return utils::getStringParam(p->m_vendor, paramValueSize, paramValue, paramValueSizeRet);
        case CL_PLATFORM_EXTENSIONS:
            return utils::getStringParam(p->m_extensions, paramValueSize, paramValue, paramValueSizeRet);
        default:
            return CL_INVALID_VALUE;
    }
}